

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::tanh_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  float fVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  long lVar5;
  
  iVar3 = (*grad->_vptr_tensor[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*dest->_vptr_tensor[2])(dest);
  iVar4 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  lVar2 = dest->m_size;
  if (grad == gradient_input) {
    if (lVar2 != 0) {
      lVar6 = 0;
      do {
        fVar1 = *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar6 * 4);
        *(float *)(lVar5 + lVar6 * 4) =
             (1.0 - fVar1 * fVar1) * *(float *)(CONCAT44(extraout_var_01,iVar4) + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar2 != lVar6);
    }
  }
  else if (lVar2 != 0) {
    lVar6 = 0;
    do {
      fVar1 = *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar6 * 4);
      *(float *)(lVar5 + lVar6 * 4) =
           (1.0 - fVar1 * fVar1) * *(float *)(CONCAT44(extraout_var_01,iVar4) + lVar6 * 4) +
           *(float *)(lVar5 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
  }
  return;
}

Assistant:

void tanh_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const auto g = grad.host();
            const auto d = dest.host();
            const auto in = gradient_input.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] = in[i]*(1-d[i]*d[i]);
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] += in[i]*(1-d[i]*d[i]);
            }
        }